

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall libtorrent::portmap_log_alert::~portmap_log_alert(portmap_log_alert *this)

{
  portmap_log_alert *this_local;
  
  std::__cxx11::string::~string((string *)&this->msg);
  libtorrent::alert::~alert(&this->super_alert);
  return;
}

Assistant:

struct TORRENT_EXPORT portmap_log_alert final : alert
	{
		// internal
		portmap_log_alert(aux::stack_allocator& alloc, portmap_transport t, const char* m);

		TORRENT_DEFINE_ALERT(portmap_log_alert, 52)

		static constexpr alert_category_t static_category = alert_category::port_mapping_log;
		std::string message() const override;

		portmap_transport const map_transport;

		// the message associated with this log line
		char const* log_message() const;

	private:

		std::reference_wrapper<aux::stack_allocator const> m_alloc;

		aux::allocation_slot m_log_idx;
#if TORRENT_ABI_VERSION == 1
	public:
		int const TORRENT_DEPRECATED_MEMBER map_type;
		std::string TORRENT_DEPRECATED_MEMBER msg;
#endif

	}